

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

wchar_t mtree_entry_setup_filenames
                  (archive_write *a,mtree_entry_conflict *file,archive_entry *entry)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  size_t local_e8;
  size_t local_b0;
  size_t local_98;
  undefined1 local_80 [8];
  archive_string as;
  char *rp;
  size_t ll;
  size_t sStack_50;
  wchar_t ret;
  size_t len;
  char *slash;
  char *dirname;
  char *p;
  char *pathname;
  archive_entry *entry_local;
  mtree_entry_conflict *file_local;
  archive_write *a_local;
  
  (file->pathname).length = 0;
  pcVar3 = archive_entry_pathname(entry);
  pcVar4 = archive_entry_pathname(entry);
  if (pcVar4 == (char *)0x0) {
    local_98 = 0;
  }
  else {
    pcVar4 = archive_entry_pathname(entry);
    local_98 = strlen(pcVar4);
  }
  archive_strncat(&file->pathname,pcVar3,local_98);
  pcVar3 = (file->pathname).s;
  iVar2 = strcmp(pcVar3,".");
  if (iVar2 == 0) {
    (file->basename).length = 0;
    archive_strncat(&file->basename,".",1);
  }
  else {
    (file->parentdir).length = 0;
    if (pcVar3 == (char *)0x0) {
      local_b0 = 0;
    }
    else {
      local_b0 = strlen(pcVar3);
    }
    archive_strncat(&file->parentdir,pcVar3,local_b0);
    sStack_50 = (file->parentdir).length;
    pcVar3 = (file->parentdir).s;
    dirname = pcVar3;
    while (*dirname != '\0') {
      if (*dirname == '/') {
        dirname = dirname + 1;
        sStack_50 = sStack_50 - 1;
      }
      else {
        if (((*dirname != '.') || (dirname[1] != '.')) || (dirname[2] != '/')) break;
        dirname = dirname + 3;
        sStack_50 = sStack_50 - 3;
      }
    }
    if (dirname != pcVar3) {
      memmove(pcVar3,dirname,sStack_50 + 1);
      dirname = pcVar3;
    }
    do {
      sVar1 = sStack_50;
      if (sStack_50 == 0) break;
      if ((sStack_50 != 0) && (dirname[sStack_50 - 1] == '/')) {
        dirname[sStack_50 - 1] = '\0';
        sStack_50 = sStack_50 - 1;
      }
      if (((1 < sStack_50) && (dirname[sStack_50 - 2] == '/')) && (dirname[sStack_50 - 1] == '.')) {
        dirname[sStack_50 - 2] = '\0';
        sStack_50 = sStack_50 - 2;
      }
      if ((((2 < sStack_50) && (dirname[sStack_50 - 3] == '/')) && (dirname[sStack_50 - 2] == '.'))
         && (dirname[sStack_50 - 1] == '.')) {
        dirname[sStack_50 - 3] = '\0';
        sStack_50 = sStack_50 - 3;
      }
    } while (sVar1 != sStack_50);
    while (*dirname != '\0') {
      if (*dirname == '/') {
        if (dirname[1] == '/') {
          sVar5 = strlen(dirname + 1);
          memmove(dirname,dirname + 1,sVar5 + 1);
        }
        else if ((dirname[1] == '.') && (dirname[2] == '/')) {
          sVar5 = strlen(dirname + 2);
          memmove(dirname,dirname + 2,sVar5 + 1);
        }
        else if ((dirname[1] == '.') &&
                ((dirname[2] == '.' && (pcVar4 = dirname, dirname[3] == '/')))) {
          do {
            as.buffer_length = (long)pcVar4 - 1;
            if (as.buffer_length < pcVar3) break;
            pcVar4 = (char *)as.buffer_length;
          } while (*(char *)as.buffer_length != '/');
          if (pcVar3 < as.buffer_length) {
            strcpy((char *)as.buffer_length,dirname + 3);
            dirname = (char *)as.buffer_length;
          }
          else {
            strcpy(pcVar3,dirname + 4);
            dirname = pcVar3;
          }
        }
        else {
          dirname = dirname + 1;
        }
      }
      else {
        dirname = dirname + 1;
      }
    }
    sStack_50 = strlen(pcVar3);
    iVar2 = strcmp(pcVar3,".");
    dirname = pcVar3;
    if ((iVar2 != 0) && (iVar2 = strncmp(pcVar3,"./",2), iVar2 != 0)) {
      local_80 = (undefined1  [8])0x0;
      as.length = 0;
      as.s = (char *)0x0;
      archive_strncat((archive_string *)local_80,"./",2);
      archive_strncat((archive_string *)local_80,pcVar3,sStack_50);
      (file->parentdir).length = 0;
      archive_string_concat(&file->parentdir,(archive_string *)local_80);
      archive_string_free((archive_string *)local_80);
      dirname = (file->parentdir).s;
      sStack_50 = (file->parentdir).length;
    }
    len = 0;
    for (; *dirname != '\0'; dirname = dirname + 1) {
      if (*dirname == '/') {
        len = (size_t)dirname;
      }
    }
    if (len == 0) {
      (file->parentdir).length = sStack_50;
      (file->basename).length = 0;
      archive_string_concat(&file->basename,&file->parentdir);
      (file->parentdir).length = 0;
      *(file->parentdir).s = '\0';
    }
    else {
      *(undefined1 *)len = 0;
      (file->parentdir).length = len - (long)(file->parentdir).s;
      (file->basename).length = 0;
      if (len == 0xffffffffffffffff) {
        local_e8 = 0;
      }
      else {
        local_e8 = strlen((char *)(len + 1));
      }
      archive_strncat(&file->basename,(void *)(len + 1),local_e8);
    }
  }
  return L'\0';
}

Assistant:

static int
mtree_entry_setup_filenames(struct archive_write *a, struct mtree_entry *file,
    struct archive_entry *entry)
{
	const char *pathname;
	char *p, *dirname, *slash;
	size_t len;
	int ret = ARCHIVE_OK;

	archive_strcpy(&file->pathname, archive_entry_pathname(entry));
#if defined(_WIN32) || defined(__CYGWIN__)
	/*
	 * Convert a path-separator from '\' to  '/'
	 */
	if (cleanup_backslash_1(file->pathname.s) != 0) {
		const wchar_t *wp = archive_entry_pathname_w(entry);
		struct archive_wstring ws;

		if (wp != NULL) {
			int r;
			archive_string_init(&ws);
			archive_wstrcpy(&ws, wp);
			cleanup_backslash_2(ws.s);
			archive_string_empty(&(file->pathname));
			r = archive_string_append_from_wcs(&(file->pathname),
			    ws.s, ws.length);
			archive_wstring_free(&ws);
			if (r < 0 && errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				return (ARCHIVE_FATAL);
			}
		}
	}
#else
	(void)a; /* UNUSED */
#endif
	pathname =  file->pathname.s;
	if (strcmp(pathname, ".") == 0) {
		archive_strcpy(&file->basename, ".");
		return (ARCHIVE_OK);
	}

	archive_strcpy(&(file->parentdir), pathname);

	len = file->parentdir.length;
	p = dirname = file->parentdir.s;

	/*
	 * Remove leading '/' and '../' elements
	 */
	while (*p) {
		if (p[0] == '/') {
			p++;
			len--;
		} else if (p[0] != '.')
			break;
		else if (p[1] == '.' && p[2] == '/') {
			p += 3;
			len -= 3;
		} else
			break;
	}
	if (p != dirname) {
		memmove(dirname, p, len+1);
		p = dirname;
	}
	/*
	 * Remove "/","/." and "/.." elements from tail.
	 */
	while (len > 0) {
		size_t ll = len;

		if (len > 0 && p[len-1] == '/') {
			p[len-1] = '\0';
			len--;
		}
		if (len > 1 && p[len-2] == '/' && p[len-1] == '.') {
			p[len-2] = '\0';
			len -= 2;
		}
		if (len > 2 && p[len-3] == '/' && p[len-2] == '.' &&
		    p[len-1] == '.') {
			p[len-3] = '\0';
			len -= 3;
		}
		if (ll == len)
			break;
	}
	while (*p) {
		if (p[0] == '/') {
			if (p[1] == '/')
				/* Convert '//' --> '/' */
				memmove(p, p+1, strlen(p+1) + 1);
			else if (p[1] == '.' && p[2] == '/')
				/* Convert '/./' --> '/' */
				memmove(p, p+2, strlen(p+2) + 1);
			else if (p[1] == '.' && p[2] == '.' && p[3] == '/') {
				/* Convert 'dir/dir1/../dir2/'
				 *     --> 'dir/dir2/'
				 */
				char *rp = p -1;
				while (rp >= dirname) {
					if (*rp == '/')
						break;
					--rp;
				}
				if (rp > dirname) {
					strcpy(rp, p+3);
					p = rp;
				} else {
					strcpy(dirname, p+4);
					p = dirname;
				}
			} else
				p++;
		} else
			p++;
	}
	p = dirname;
	len = strlen(p);

	/*
	 * Add "./" prefix.
	 * NOTE: If the pathname does not have a path separator, we have
	 * to add "./" to the head of the pathname because mtree reader
	 * will suppose that it is v1(a.k.a classic) mtree format and
	 * change the directory unexpectedly and so it will make a wrong
	 * path.
	 */
	if (strcmp(p, ".") != 0 && strncmp(p, "./", 2) != 0) {
		struct archive_string as;
		archive_string_init(&as);
		archive_strcpy(&as, "./");
		archive_strncat(&as, p, len);
		archive_string_empty(&file->parentdir);
		archive_string_concat(&file->parentdir, &as);
		archive_string_free(&as);
		p = file->parentdir.s;
		len = archive_strlen(&file->parentdir);
	}

	/*
	 * Find out the position which points the last position of
	 * path separator('/').
	 */
	slash = NULL;
	for (; *p != '\0'; p++) {
		if (*p == '/')
			slash = p;
	}
	if (slash == NULL) {
		/* The pathname doesn't have a parent directory. */
		file->parentdir.length = len;
		archive_string_copy(&(file->basename), &(file->parentdir));
		archive_string_empty(&(file->parentdir));
		*file->parentdir.s = '\0';
		return (ret);
	}

	/* Make a basename from file->parentdir.s and slash */
	*slash  = '\0';
	file->parentdir.length = slash - file->parentdir.s;
	archive_strcpy(&(file->basename),  slash + 1);
	return (ret);
}